

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

void __thiscall Logger::~Logger(Logger *this)

{
  Buffer *logline;
  char **ppcVar1;
  pointer pcVar2;
  char *pcVar3;
  
  ppcVar1 = &(this->impl_).stream_.buffer_.cur_;
  pcVar3 = (this->impl_).stream_.buffer_.cur_;
  if (0x1b < (int)ppcVar1 - (int)pcVar3) {
    builtin_strncpy(pcVar3,"\n+-----------------------+\n",0x1b);
    pcVar3 = *ppcVar1 + 0x1b;
    *ppcVar1 = pcVar3;
  }
  pthread_once(&once_control_,once_init);
  logline = &(this->impl_).stream_.buffer_;
  AsyncLogging::append(AsyncLogger_,logline->data_,(int)pcVar3 - (int)logline);
  pcVar2 = (this->impl_).basename_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->impl_).basename_.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

Logger::~Logger()
{
    //printf("Class Logger num:%d Deleted!\n",ClassNum_);
    impl_.stream_ << "\n+-----------------------+\n";
    //impl_.stream_ << " -- " << impl_.basename_ << ':' << impl_.line_ << '\n';
    //impl_.stream_ << "-------------------------\n";

    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}